

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.cpp
# Opt level: O1

int __thiscall
TPZKrylovEigenSolver<std::complex<double>_>::SolveGeneralisedEigenProblem
          (TPZKrylovEigenSolver<std::complex<double>_> *this,TPZVec<std::complex<double>_> *w)

{
  int iVar1;
  TPZFMatrix<std::complex<double>_> local_b0;
  
  local_b0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
  local_b0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
  local_b0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_b0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_b0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
  local_b0.fElem = (complex<double> *)0x0;
  local_b0.fGiven = (complex<double> *)0x0;
  local_b0.fSize = 0;
  TPZVec<int>::TPZVec(&local_b0.fPivot.super_TPZVec<int>,0);
  local_b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_b0.fPivot.super_TPZVec<int>.fStore = local_b0.fPivot.fExtAlloc;
  local_b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
  local_b0.fWork.fStore = (complex<double> *)0x0;
  local_b0.fWork.fNElements = 0;
  local_b0.fWork.fNAlloc = 0;
  iVar1 = SolveImpl(this,w,&local_b0,false);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_b0);
  return iVar1;
}

Assistant:

int TPZKrylovEigenSolver<TVar>::SolveGeneralisedEigenProblem(TPZVec<CTVar> &w)
{
  TPZFMatrix<CTVar> eigenVectors;
  return SolveImpl(w, eigenVectors,false);
}